

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[21],unsigned_int,char[48],unsigned_int,char[18],char_const*,char[43]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [21],uint *RestArgs,char (*RestArgs_1) [48],uint *RestArgs_2,
               char (*RestArgs_3) [18],char **RestArgs_4,char (*RestArgs_5) [43])

{
  char (*RestArgs_local_3) [18];
  uint *RestArgs_local_2;
  char (*RestArgs_local_1) [48];
  uint *RestArgs_local;
  char (*FirstArg_local) [21];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[21]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_int,char[48],unsigned_int,char[18],char_const*,char[43]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}